

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O3

void Cmd_rebind(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *copyStr;
  uint uVar2;
  FKeyBindings *pFVar3;
  bool bVar4;
  
  if (key == 0) {
    Printf("Rebind cannot be used from the console\n");
    return;
  }
  bVar4 = -1 < (short)key;
  uVar2 = key & 0x7fff;
  if (bVar4) {
    uVar2 = key;
  }
  pFVar3 = &DoubleBindings;
  if (bVar4) {
    pFVar3 = &Bindings;
  }
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    copyStr = FCommandLine::operator[](argv,1);
    if (uVar2 < 0x1c4) {
      FString::operator=(pFVar3->Binds + uVar2,copyStr);
      return;
    }
  }
  return;
}

Assistant:

CCMD (rebind)
{
	FKeyBindings *bindings;

	if (key == 0)
	{
		Printf ("Rebind cannot be used from the console\n");
		return;
	}

	if (key & KEY_DBLCLICKED)
	{
		bindings = &DoubleBindings;
		key &= KEY_DBLCLICKED-1;
	}
	else
	{
		bindings = &Bindings;
	}

	if (argv.argc() > 1)
	{
		bindings->SetBind(key, argv[1]);
	}
}